

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

String * __thiscall
kj::HttpHeaders::serialize
          (String *__return_storage_ptr__,HttpHeaders *this,ArrayPtr<const_char> word1,
          ArrayPtr<const_char> word2,ArrayPtr<const_char> word3,
          ArrayPtr<const_kj::StringPtr> connectionHeaders)

{
  size_t *rest;
  ulong uVar1;
  HttpHeaderTable *pHVar2;
  bool bVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  Header *pHVar7;
  unsigned_long *puVar8;
  char *pcVar9;
  char *pcVar10;
  Range<unsigned_long> RVar11;
  ArrayPtr<const_char> AVar12;
  HttpHeaderId id;
  HttpHeaderId id_00;
  StringPtr *local_270;
  StringPtr *local_1f0;
  Fault local_1a0;
  Fault f_1;
  Header *header_1;
  Header *__end1_3;
  Header *__begin1_3;
  Vector<kj::HttpHeaders::Header> *__range1_3;
  undefined4 local_170;
  ArrayPtr<const_char> local_168;
  undefined1 auStack_158 [8];
  StringPtr value_1;
  unsigned_long i_1;
  Iterator __end1_2;
  Iterator __begin1_2;
  Range<unsigned_long> *__range1_2;
  char *ptr;
  Header *header;
  Header *__end1_1;
  Header *__begin1_1;
  Vector<kj::HttpHeaders::Header> *__range1_1;
  undefined4 local_e0;
  ArrayPtr<const_char> local_d8;
  undefined1 local_c8 [8];
  StringPtr value;
  unsigned_long i;
  Iterator __end1;
  Iterator __begin1;
  Range<unsigned_long> *__range1;
  Fault local_78;
  Fault f;
  size_t size;
  StringPtr colon;
  StringPtr newline;
  StringPtr space;
  HttpHeaders *this_local;
  ArrayPtr<const_char> word2_local;
  ArrayPtr<const_char> word1_local;
  String *result;
  
  word2_local.size_ = (size_t)word1.ptr;
  word2_local.ptr = (char *)word2.size_;
  this_local = (HttpHeaders *)word2.ptr;
  StringPtr::StringPtr((StringPtr *)&newline.content.size_," ");
  StringPtr::StringPtr((StringPtr *)&colon.content.size_,"\r\n");
  StringPtr::StringPtr((StringPtr *)&size,": ");
  f.exception = (Exception *)0x2;
  bVar3 = ArrayPtr<const_char>::operator!=((ArrayPtr<const_char> *)&word2_local.size_,(void *)0x0);
  if (bVar3) {
    sVar5 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)&word2_local.size_);
    sVar6 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)&this_local);
    sVar4 = ArrayPtr<const_char>::size(&word3);
    f.exception = (Exception *)((long)(f.exception)->trace + sVar5 + sVar6 + sVar4 + -0x4c);
  }
  sVar5 = ArrayPtr<const_kj::StringPtr>::size(&connectionHeaders);
  sVar6 = Array<kj::StringPtr>::size(&this->indexedHeaders);
  if (sVar6 < sVar5) {
    _::Debug::Fault::Fault
              (&local_78,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x3bc,FAILED,"connectionHeaders.size() <= indexedHeaders.size()","");
    _::Debug::Fault::fatal(&local_78);
  }
  ___begin1 = indices<kj::Array<kj::StringPtr>const&>(&this->indexedHeaders);
  __end1 = Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin1);
  i = (unsigned_long)Range<unsigned_long>::end((Range<unsigned_long> *)&__begin1);
  while (bVar3 = Range<unsigned_long>::Iterator::operator!=(&__end1,(Iterator *)&i), bVar3) {
    puVar8 = Range<unsigned_long>::Iterator::operator*(&__end1);
    uVar1 = *puVar8;
    value.content.size_ = uVar1;
    sVar5 = ArrayPtr<const_kj::StringPtr>::size(&connectionHeaders);
    if (uVar1 < sVar5) {
      local_1f0 = ArrayPtr<const_kj::StringPtr>::operator[](&connectionHeaders,value.content.size_);
    }
    else {
      local_1f0 = Array<kj::StringPtr>::operator[](&this->indexedHeaders,value.content.size_);
    }
    local_c8 = (undefined1  [8])(local_1f0->content).ptr;
    value.content.ptr = (char *)(local_1f0->content).size_;
    bVar3 = StringPtr::operator!=((StringPtr *)local_c8,(void *)0x0);
    if (bVar3) {
      pHVar2 = this->table;
      HttpHeaderId::HttpHeaderId((HttpHeaderId *)&__range1_1,this->table,(uint)value.content.size_);
      id._12_4_ = 0;
      id.table = (HttpHeaderTable *)__range1_1;
      id.id = local_e0;
      local_d8 = (ArrayPtr<const_char>)HttpHeaderTable::idToString(pHVar2,id);
      sVar5 = StringPtr::size((StringPtr *)&local_d8);
      sVar6 = StringPtr::size((StringPtr *)local_c8);
      f.exception = (Exception *)((long)(f.exception)->trace + sVar5 + sVar6 + -0x4c);
    }
    Range<unsigned_long>::Iterator::operator++(&__end1);
  }
  __end1_1 = Vector<kj::HttpHeaders::Header>::begin(&this->unindexedHeaders);
  pHVar7 = Vector<kj::HttpHeaders::Header>::end(&this->unindexedHeaders);
  for (; __end1_1 != pHVar7; __end1_1 = __end1_1 + 1) {
    sVar5 = StringPtr::size(&__end1_1->name);
    sVar6 = StringPtr::size(&__end1_1->value);
    f.exception = (Exception *)((long)(f.exception)->trace + sVar5 + sVar6 + -0x4c);
  }
  heapString(__return_storage_ptr__,(size_t)f.exception);
  __range1_2 = (Range<unsigned_long> *)String::begin(__return_storage_ptr__);
  bVar3 = ArrayPtr<const_char>::operator!=((ArrayPtr<const_char> *)&word2_local.size_,(void *)0x0);
  if (bVar3) {
    rest = &newline.content.size_;
    __range1_2 = (Range<unsigned_long> *)
                 _::
                 fill<kj::ArrayPtr<char_const>,kj::StringPtr_const&,kj::ArrayPtr<char_const>&,kj::StringPtr_const&,kj::ArrayPtr<char_const>&,kj::StringPtr_const&>
                           ((char *)__range1_2,(ArrayPtr<const_char> *)&word2_local.size_,
                            (StringPtr *)rest,(ArrayPtr<const_char> *)&this_local,(StringPtr *)rest,
                            &word3,(StringPtr *)&colon.content.size_);
  }
  RVar11 = indices<kj::Array<kj::StringPtr>const&>(&this->indexedHeaders);
  __begin1_2.value = RVar11.begin_;
  __end1_2 = Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin1_2);
  i_1 = (unsigned_long)Range<unsigned_long>::end((Range<unsigned_long> *)&__begin1_2);
  while( true ) {
    bVar3 = Range<unsigned_long>::Iterator::operator!=(&__end1_2,(Iterator *)&i_1);
    if (!bVar3) break;
    puVar8 = Range<unsigned_long>::Iterator::operator*(&__end1_2);
    uVar1 = *puVar8;
    value_1.content.size_ = uVar1;
    sVar5 = ArrayPtr<const_kj::StringPtr>::size(&connectionHeaders);
    if (uVar1 < sVar5) {
      local_270 = ArrayPtr<const_kj::StringPtr>::operator[]
                            (&connectionHeaders,value_1.content.size_);
    }
    else {
      local_270 = Array<kj::StringPtr>::operator[](&this->indexedHeaders,value_1.content.size_);
    }
    auStack_158 = (undefined1  [8])(local_270->content).ptr;
    value_1.content.ptr = (char *)(local_270->content).size_;
    bVar3 = StringPtr::operator!=((StringPtr *)auStack_158,(void *)0x0);
    if (bVar3) {
      pHVar2 = this->table;
      HttpHeaderId::HttpHeaderId((HttpHeaderId *)&__range1_3,pHVar2,(uint)value_1.content.size_);
      id_00._12_4_ = 0;
      id_00.table = (HttpHeaderTable *)__range1_3;
      id_00.id = local_170;
      AVar12 = (ArrayPtr<const_char>)HttpHeaderTable::idToString(pHVar2,id_00);
      local_168 = AVar12;
      __range1_2 = (Range<unsigned_long> *)
                   _::fill<kj::StringPtr,kj::StringPtr_const&,kj::StringPtr&,kj::StringPtr_const&>
                             ((char *)__range1_2,(StringPtr *)&local_168,(StringPtr *)&size,
                              (StringPtr *)auStack_158,(StringPtr *)&colon.content.size_);
    }
    Range<unsigned_long>::Iterator::operator++(&__end1_2);
  }
  __end1_3 = Vector<kj::HttpHeaders::Header>::begin(&this->unindexedHeaders);
  pHVar7 = Vector<kj::HttpHeaders::Header>::end(&this->unindexedHeaders);
  for (; __end1_3 != pHVar7; __end1_3 = __end1_3 + 1) {
    f_1.exception = (Exception *)__end1_3;
    __range1_2 = (Range<unsigned_long> *)
                 _::
                 fill<kj::StringPtr,kj::StringPtr_const&,kj::StringPtr_const&,kj::StringPtr_const&>
                           ((char *)__range1_2,&__end1_3->name,(StringPtr *)&size,&__end1_3->value,
                            (StringPtr *)&colon.content.size_);
  }
  pcVar9 = _::fill<kj::StringPtr>((char *)__range1_2,(StringPtr *)&colon.content.size_);
  pcVar10 = String::end(__return_storage_ptr__);
  if (pcVar9 == pcVar10) {
    return __return_storage_ptr__;
  }
  _::Debug::Fault::Fault
            (&local_1a0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x3d8,FAILED,"ptr == result.end()","");
  _::Debug::Fault::fatal(&local_1a0);
}

Assistant:

kj::String HttpHeaders::serialize(kj::ArrayPtr<const char> word1,
                                  kj::ArrayPtr<const char> word2,
                                  kj::ArrayPtr<const char> word3,
                                  kj::ArrayPtr<const kj::StringPtr> connectionHeaders) const {
  const kj::StringPtr space = " ";
  const kj::StringPtr newline = "\r\n";
  const kj::StringPtr colon = ": ";

  size_t size = 2;  // final \r\n
  if (word1 != nullptr) {
    size += word1.size() + word2.size() + word3.size() + 4;
  }
  KJ_ASSERT(connectionHeaders.size() <= indexedHeaders.size());
  for (auto i: kj::indices(indexedHeaders)) {
    kj::StringPtr value = i < connectionHeaders.size() ? connectionHeaders[i] : indexedHeaders[i];
    if (value != nullptr) {
      size += table->idToString(HttpHeaderId(table, i)).size() + value.size() + 4;
    }
  }
  for (auto& header: unindexedHeaders) {
    size += header.name.size() + header.value.size() + 4;
  }

  String result = heapString(size);
  char* ptr = result.begin();

  if (word1 != nullptr) {
    ptr = kj::_::fill(ptr, word1, space, word2, space, word3, newline);
  }
  for (auto i: kj::indices(indexedHeaders)) {
    kj::StringPtr value = i < connectionHeaders.size() ? connectionHeaders[i] : indexedHeaders[i];
    if (value != nullptr) {
      ptr = kj::_::fill(ptr, table->idToString(HttpHeaderId(table, i)), colon, value, newline);
    }
  }
  for (auto& header: unindexedHeaders) {
    ptr = kj::_::fill(ptr, header.name, colon, header.value, newline);
  }
  ptr = kj::_::fill(ptr, newline);

  KJ_ASSERT(ptr == result.end());
  return result;
}